

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3GetVarint32(char *p,int *pi)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (uint)(byte)p[1] << 7;
  uVar3 = uVar2 | (byte)*p & 0x7f;
  if (p[1] < '\0') {
    uVar2 = uVar2 & 0x3fff | (byte)*p & 0x7f;
    uVar4 = (uint)(byte)p[2] << 0xe;
    uVar3 = uVar4 | uVar2;
    if (p[2] < '\0') {
      uVar2 = uVar4 & 0x1fffff | uVar2;
      uVar4 = (uint)(byte)p[3] << 0x15;
      uVar3 = uVar4 | uVar2;
      if (p[3] < '\0') {
        uVar3 = uVar4 & 0xfffffff | uVar2 | ((byte)p[4] & 7) << 0x1c;
        iVar1 = 5;
      }
      else {
        iVar1 = 4;
      }
    }
    else {
      iVar1 = 3;
    }
  }
  else {
    iVar1 = 2;
  }
  *pi = uVar3;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3GetVarint32(const char *p, int *pi){
  const unsigned char *ptr = (const unsigned char*)p;
  u32 a;

#ifndef fts3GetVarint32
  GETVARINT_INIT(a, ptr, 0,  0x00,     0x80, *pi, 1);
#else
  a = (*ptr++);
  assert( a & 0x80 );
#endif

  GETVARINT_STEP(a, ptr, 7,  0x7F,     0x4000, *pi, 2);
  GETVARINT_STEP(a, ptr, 14, 0x3FFF,   0x200000, *pi, 3);
  GETVARINT_STEP(a, ptr, 21, 0x1FFFFF, 0x10000000, *pi, 4);
  a = (a & 0x0FFFFFFF );
  *pi = (int)(a | ((u32)(*ptr & 0x07) << 28));
  assert( 0==(a & 0x80000000) );
  assert( *pi>=0 );
  return 5;
}